

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_char.h
# Opt level: O0

vec_char_t * vec_char_init(uint size,char value)

{
  vec_char_t *pvVar1;
  char *local_20;
  vec_char_t *p;
  char value_local;
  uint size_local;
  
  pvVar1 = (vec_char_t *)malloc(0x10);
  pvVar1->cap = size;
  pvVar1->size = size;
  if (pvVar1->cap == 0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = (char *)malloc((ulong)pvVar1->cap);
  }
  pvVar1->data = local_20;
  memset(pvVar1->data,(uint)(byte)value,(ulong)pvVar1->size);
  return pvVar1;
}

Assistant:

static inline vec_char_t * vec_char_init(unsigned size, char value)
{
    vec_char_t *p = satoko_alloc(vec_char_t, 1);

    p->cap = size;
    p->size = size;
    p->data = p->cap ? satoko_alloc(char, p->cap) : NULL;
    memset(p->data, value, sizeof(char) * p->size);
    return p;
}